

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void Blowfish_expand0state(blf_ctx *c,uint8_t *key,uint16_t keybytes)

{
  uint32_t local_34;
  uint32_t local_30;
  uint32_t datar;
  uint32_t datal;
  uint32_t temp;
  int iStack_20;
  uint16_t j;
  int k;
  int i;
  uint16_t keybytes_local;
  uint8_t *key_local;
  blf_ctx *c_local;
  
  datal._2_2_ = 0;
  k._2_2_ = keybytes;
  _i = key;
  key_local = (uint8_t *)c;
  for (iStack_20 = 0; iStack_20 < 0x12; iStack_20 = iStack_20 + 1) {
    datar = Blowfish_stream2word(_i,k._2_2_,(uint16_t *)((long)&datal + 2));
    *(uint *)(key_local + (long)iStack_20 * 4 + 0x1000) =
         *(uint *)(key_local + (long)iStack_20 * 4 + 0x1000) ^ datar;
  }
  datal._2_2_ = 0;
  local_30 = 0;
  local_34 = 0;
  for (iStack_20 = 0; iStack_20 < 0x12; iStack_20 = iStack_20 + 2) {
    Blowfish_encipher((blf_ctx *)key_local,&local_30,&local_34);
    *(uint32_t *)(key_local + (long)iStack_20 * 4 + 0x1000) = local_30;
    *(uint32_t *)(key_local + (long)(iStack_20 + 1) * 4 + 0x1000) = local_34;
  }
  for (iStack_20 = 0; iStack_20 < 4; iStack_20 = iStack_20 + 1) {
    for (temp = 0; (int)temp < 0x100; temp = temp + 2) {
      Blowfish_encipher((blf_ctx *)key_local,&local_30,&local_34);
      *(uint32_t *)(key_local + (long)(int)temp * 4 + (long)iStack_20 * 0x400) = local_30;
      *(uint32_t *)(key_local + (long)(int)(temp + 1) * 4 + (long)iStack_20 * 0x400) = local_34;
    }
  }
  return;
}

Assistant:

static void
Blowfish_expand0state(blf_ctx *c, const uint8_t *key, uint16_t keybytes)
{
    int i;
    int k;
    uint16_t j;
    uint32_t temp;
    uint32_t datal;
    uint32_t datar;

    j = 0;
    for(i = 0; i < BLF_N + 2; i++) {
        /* Extract 4 int8 to 1 int32 from keystream */
        temp = Blowfish_stream2word(key, keybytes, &j);
        c->P[i] = c->P[i] ^ temp;
    }

    j = 0;
    datal = 0x00000000;
    datar = 0x00000000;
    for(i = 0; i < BLF_N + 2; i += 2) {
        Blowfish_encipher(c, &datal, &datar);

        c->P[i] = datal;
        c->P[i + 1] = datar;
    }

    for(i = 0; i < 4; i++) {
        for(k = 0; k < 256; k += 2) {
            Blowfish_encipher(c, &datal, &datar);

            c->S[i][k] = datal;
            c->S[i][k + 1] = datar;
        }
    }
}